

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O1

bool __thiscall
bssl::anon_unknown_0::X25519MLKEM768KeyShare::Decap
          (X25519MLKEM768KeyShare *this,Array<unsigned_char> *out_secret,uint8_t *out_alert,
          Span<const_unsigned_char> ciphertext)

{
  int iVar1;
  bool bVar2;
  Array<unsigned_char> secret;
  uint8_t *local_38;
  
  *out_alert = 'P';
  OPENSSL_free((void *)0x0);
  local_38 = (uint8_t *)OPENSSL_malloc(0x40);
  if (local_38 == (uint8_t *)0x0) {
    bVar2 = false;
  }
  else {
    if (ciphertext.size_ == 0x460) {
      iVar1 = MLKEM768_decap(local_38,ciphertext.data_,0x440,&this->mlkem_private_key_);
      if (iVar1 != 0) {
        iVar1 = X25519(local_38 + 0x20,this->x25519_private_key_,ciphertext.data_ + 0x440);
        if (iVar1 != 0) {
          OPENSSL_free(out_secret->data_);
          out_secret->data_ = (uchar *)0x0;
          out_secret->size_ = 0;
          out_secret->data_ = local_38;
          out_secret->size_ = 0x40;
          local_38 = (uint8_t *)0x0;
          bVar2 = true;
          goto LAB_00157980;
        }
      }
    }
    *out_alert = '/';
    bVar2 = false;
    ERR_put_error(0x10,0,0x6c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_key_share.cc"
                  ,0x16d);
  }
LAB_00157980:
  OPENSSL_free(local_38);
  return bVar2;
}

Assistant:

bool Decap(Array<uint8_t> *out_secret, uint8_t *out_alert,
             Span<const uint8_t> ciphertext) override {
    *out_alert = SSL_AD_INTERNAL_ERROR;

    Array<uint8_t> secret;
    if (!secret.InitForOverwrite(MLKEM_SHARED_SECRET_BYTES +
                                 X25519_SHARED_KEY_LEN)) {
      return false;
    }

    if (ciphertext.size() !=
            MLKEM768_CIPHERTEXT_BYTES + X25519_PUBLIC_VALUE_LEN ||
        !MLKEM768_decap(secret.data(), ciphertext.data(),
                        MLKEM768_CIPHERTEXT_BYTES, &mlkem_private_key_) ||
        !X25519(secret.data() + MLKEM_SHARED_SECRET_BYTES, x25519_private_key_,
                ciphertext.data() + MLKEM768_CIPHERTEXT_BYTES)) {
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_ECPOINT);
      return false;
    }

    *out_secret = std::move(secret);
    return true;
  }